

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

float __thiscall experimental::pdf(experimental *this,Ray *ray,Vector3f *dir,Hit *h)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Material *pMVar5;
  Vector3f *pVVar6;
  float *pfVar7;
  float *pfVar8;
  cosineWeightedHemisphere *this_00;
  pureReflectance *this_01;
  float fVar9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  Sampler *sampler_ref;
  Sampler *sampler_diff;
  float pdf;
  float prob_spec;
  Vector3f spec;
  Vector3f diff;
  Hit *h_local;
  Vector3f *dir_local;
  Ray *ray_local;
  experimental *this_local;
  
  pMVar5 = Hit::getMaterial(h);
  pVVar6 = Material::getDiffuseColor(pMVar5);
  pfVar8 = spec.m_elements + 1;
  Vector3f::Vector3f((Vector3f *)pfVar8,pVVar6);
  pMVar5 = Hit::getMaterial(h);
  pVVar6 = Material::getSpecularColor(pMVar5);
  Vector3f::Vector3f((Vector3f *)&pdf,pVVar6);
  pfVar7 = Vector3f::operator[]((Vector3f *)pfVar8,0);
  fVar9 = *pfVar7;
  pfVar7 = Vector3f::operator[]((Vector3f *)pfVar8,1);
  fVar1 = *pfVar7;
  pfVar8 = Vector3f::operator[]((Vector3f *)pfVar8,2);
  fVar2 = *pfVar8;
  pfVar8 = Vector3f::operator[]((Vector3f *)&pdf,0);
  fVar3 = *pfVar8;
  pfVar8 = Vector3f::operator[]((Vector3f *)&pdf,1);
  fVar4 = *pfVar8;
  pfVar8 = Vector3f::operator[]((Vector3f *)&pdf,2);
  fVar9 = 1.0 / ((fVar9 + fVar1 + fVar2) / (fVar3 + fVar4 + *pfVar8) + 1.0);
  this_00 = (cosineWeightedHemisphere *)operator_new(8);
  cosineWeightedHemisphere::cosineWeightedHemisphere(this_00);
  (*(this_00->super_Sampler)._vptr_Sampler[3])(this_00,ray,dir,h);
  this_01 = (pureReflectance *)operator_new(8);
  pureReflectance::pureReflectance(this_01);
  (*(this_01->super_Sampler)._vptr_Sampler[3])(this_01,ray,dir,h);
  return fVar9 * extraout_XMM0_Da_00 + (1.0 - fVar9) * extraout_XMM0_Da + 0.0;
}

Assistant:

float experimental::pdf(const Ray &ray, const Vector3f &dir, Hit &h) const {
    Vector3f diff = h.getMaterial()->getDiffuseColor();
    Vector3f spec = h.getMaterial()->getSpecularColor();
    float prob_spec = 1.f / (1.f + (diff[0] + diff[1] + diff[2]) / (spec[0] + spec[1] + spec[2]));

    float pdf = 0;
    Sampler* sampler_diff = new cosineWeightedHemisphere;
    pdf += (1-prob_spec) * sampler_diff->pdf(ray, dir, h);
    Sampler* sampler_ref = new pureReflectance;
    pdf += prob_spec * sampler_ref->pdf(ray, dir, h);

    return pdf;
}